

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# red_black_tree.h
# Opt level: O0

RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_> *
__thiscall
data_structures::RBTree<int,_data_structures::WeightedGraphAdjSet<int,_int>_>::_leftMove
          (RBTree<int,_data_structures::WeightedGraphAdjSet<int,_int>_> *this,
          RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
          *node)

{
  bool bVar1;
  RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
  *pRVar2;
  RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
  *pRVar3;
  RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
  *right;
  RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
  *node_local;
  RBTree<int,_data_structures::WeightedGraphAdjSet<int,_int>_> *this_local;
  
  bVar1 = RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
          ::isRed(node);
  this_local = (RBTree<int,_data_structures::WeightedGraphAdjSet<int,_int>_> *)node;
  if (bVar1) {
    pRVar2 = RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
             ::left(node);
    if (pRVar2 != (RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
                   *)0x0) {
      pRVar2 = RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
               ::left(node);
      bVar1 = RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
              ::isRed(pRVar2);
      if (bVar1) {
        return node;
      }
    }
    pRVar2 = RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
             ::right(node);
    if (pRVar2 != (RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
                   *)0x0) {
      pRVar2 = RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
               ::right(node);
      bVar1 = RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
              ::isRed(pRVar2);
      if (bVar1) {
        pRVar2 = _leftRotate(this,node);
        return pRVar2;
      }
    }
    bVar1 = _flipColors(this,node);
    if (bVar1) {
      pRVar2 = RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
               ::right(node);
      pRVar3 = RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
               ::left(pRVar2);
      if (pRVar3 != (RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
                     *)0x0) {
        pRVar3 = RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
                 ::left(pRVar2);
        bVar1 = RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
                ::isRed(pRVar3);
        if (bVar1) {
          _rightRotate(this,pRVar2);
          this_local = (RBTree<int,_data_structures::WeightedGraphAdjSet<int,_int>_> *)
                       _leftRotate(this,node);
          _flipColors(this,(RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
                            *)this_local);
        }
      }
    }
  }
  return (RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
          *)this_local;
}

Assistant:

inline
    RBTreeNode<TreeElement<Key, Value>>* RBTree<Key, Value>::_leftMove(RBTreeNode<TreeElement<Key, Value>> *node){
        if (!node->isRed()) {
            return node;
        }
        if (node->left() != nullptr && node->left()->isRed()) {
            return node;
        }
        if (node->right() != nullptr && node->right()->isRed()) {
            node = _leftRotate(node);
            return node;
        }
        if (!_flipColors(node)) {
            return node;
        }
        // if node is red, left and right nodes are not red
        auto right = node->right();
        if (right->left() == nullptr || !right->left()->isRed()) {
            return node;
        }
        _rightRotate(right);
        node = _leftRotate(node);
        _flipColors(node);
        return node;
    }